

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::MethodDescriptorProto::InternalSerializeWithCachedSizesToArray
          (MethodDescriptorProto *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  string *psVar5;
  UnknownFieldSet *unknown_fields;
  uint8 *puStack_40;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  MethodDescriptorProto *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  puStack_40 = target;
  if ((uVar1 & 1) != 0) {
    name_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar3,SERIALIZE,"google.protobuf.MethodDescriptorProto.name");
    psVar5 = name_abi_cxx11_(this);
    puStack_40 = internal::WireFormatLite::WriteStringToArray(1,psVar5,target);
  }
  if ((uVar1 & 2) != 0) {
    input_type_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    input_type_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar3,SERIALIZE,"google.protobuf.MethodDescriptorProto.input_type");
    psVar5 = input_type_abi_cxx11_(this);
    puStack_40 = internal::WireFormatLite::WriteStringToArray(2,psVar5,puStack_40);
  }
  if ((uVar1 & 4) != 0) {
    output_type_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    output_type_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar3,SERIALIZE,"google.protobuf.MethodDescriptorProto.output_type");
    psVar5 = output_type_abi_cxx11_(this);
    puStack_40 = internal::WireFormatLite::WriteStringToArray(3,psVar5,puStack_40);
  }
  if ((uVar1 & 8) != 0) {
    puStack_40 = internal::WireFormatLite::
                 InternalWriteMessageNoVirtualToArray<google::protobuf::MethodOptions>
                           (4,this->options_,deterministic,puStack_40);
  }
  if ((uVar1 & 0x10) != 0) {
    bVar2 = client_streaming(this);
    puStack_40 = internal::WireFormatLite::WriteBoolToArray(5,bVar2,puStack_40);
  }
  if ((uVar1 & 0x20) != 0) {
    bVar2 = server_streaming(this);
    puStack_40 = internal::WireFormatLite::WriteBoolToArray(6,bVar2,puStack_40);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = MethodDescriptorProto::unknown_fields(this);
    puStack_40 = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,puStack_40);
  }
  return puStack_40;
}

Assistant:

::google::protobuf::uint8* MethodDescriptorProto::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.MethodDescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.MethodDescriptorProto.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string input_type = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->input_type().data(), this->input_type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.MethodDescriptorProto.input_type");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->input_type(), target);
  }

  // optional string output_type = 3;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->output_type().data(), this->output_type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.MethodDescriptorProto.output_type");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        3, this->output_type(), target);
  }

  // optional .google.protobuf.MethodOptions options = 4;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        4, *this->options_, deterministic, target);
  }

  // optional bool client_streaming = 5 [default = false];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(5, this->client_streaming(), target);
  }

  // optional bool server_streaming = 6 [default = false];
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(6, this->server_streaming(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.MethodDescriptorProto)
  return target;
}